

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collapse_unit_test.cpp
# Opt level: O2

void __thiscall collapse::test_method(collapse *this)

{
  ostream *poVar1;
  initializer_list<std::tuple<short,_short,_float>_> __l;
  initializer_list<std::tuple<short,_short,_float>_> __l_00;
  initializer_list<std::tuple<short,_short,_float>_> __l_01;
  initializer_list<std::tuple<short,_short,_float>_> __l_02;
  initializer_list<std::tuple<short,_short,_float>_> __l_03;
  int local_6c;
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
  local_68;
  undefined8 uStack_50;
  Filtered_edge_list edges;
  _Tuple_impl<1UL,_short,_float> local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"***** COLLAPSE *****");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x13f800000;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x100023f800000;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x200033f800000;
  uStack_50 = 0x300003f800000;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_68;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector(&edges,__l,(allocator_type *)&local_28);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            (&edges,(Filtered_edge_list *)&local_68);
  std::
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~_Vector_base(&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0.0;
  local_6c = 2;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4000000000000000;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0x1;
  local_6c = 3;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4000cccccccccccd;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0x40066666;
  local_28.super__Head_base<1UL,_short,_false>._M_head_impl = 3;
  local_28._6_2_ = 1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_28;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
          *)&local_68,__l_00,(allocator_type *)&local_6c);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            (&edges,(Filtered_edge_list *)&local_68);
  std::
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~_Vector_base(&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)2.8026e-45;
  local_6c = 4;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)5.60519e-45;
  local_6c = 5;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0x5;
  local_6c = 3;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4008000000000000;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0x40000000;
  local_28.super__Head_base<1UL,_short,_false>._M_head_impl = 3;
  local_28._6_2_ = 1;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&local_28;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
          *)&local_68,__l_01,(allocator_type *)&local_6c);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            (&edges,(Filtered_edge_list *)&local_68);
  std::
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~_Vector_base(&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)2.8026e-45;
  local_6c = 5;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0x4;
  local_6c = 3;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4010666666666666;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0x40000000;
  local_28.super__Head_base<1UL,_short,_false>._M_head_impl = 3;
  local_28._6_2_ = 1;
  uStack_20 = 0x4000340833333;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&local_28;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
          *)&local_68,__l_02,(allocator_type *)&local_6c);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            (&edges,(Filtered_edge_list *)&local_68);
  std::
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~_Vector_base(&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)1.4013e-45;
  local_6c = 5;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4014000000000000;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28 = (_Tuple_impl<1UL,_short,_float>)((ulong)(uint)local_28._4_4_ << 0x20);
  local_6c = 4;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x4014666666666666;
  std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>::
  emplace_back<int,int,double>
            ((vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>> *)
             &edges,(int *)&local_28,&local_6c,(double *)&local_68);
  local_28.super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl =
       (_Head_base<2UL,_float,_false>)0x40000000;
  local_28.super__Head_base<1UL,_short,_false>._M_head_impl = 3;
  local_28._6_2_ = 1;
  uStack_20 = 0x4000340800000;
  local_18 = 0x440a33333;
  __l_03._M_len = 3;
  __l_03._M_array = (iterator)&local_28;
  std::vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  vector((vector<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
          *)&local_68,__l_03,(allocator_type *)&local_6c);
  trace_and_check_collapse<std::vector<std::tuple<short,short,float>,std::allocator<std::tuple<short,short,float>>>>
            (&edges,(Filtered_edge_list *)&local_68);
  std::
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~_Vector_base(&local_68);
  std::
  _Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>::
  ~_Vector_base(&edges.
                 super__Vector_base<std::tuple<short,_short,_float>,_std::allocator<std::tuple<short,_short,_float>_>_>
               );
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(collapse) {
  std::cout << "***** COLLAPSE *****" << std::endl;
  //  1   2
  //  o---o
  //  |   |
  //  |   |
  //  |   |
  //  o---o
  //  0   3
  Filtered_edge_list edges {{0, 1, 1.},
                            {1, 2, 1.},
                            {2, 3, 1.},
                            {3, 0, 1.}};
  trace_and_check_collapse(edges, {});
  
  //  1   2
  //  o---o
  //  |\ /|
  //  | x |
  //  |/ \|
  //  o---o
  //  0   3
  edges.emplace_back(0, 2, 2.);
  edges.emplace_back(1, 3, 2.1);
  trace_and_check_collapse(edges, {{1, 3, 2.1}});

  //  1   2   4
  //  o---o---o
  //  |\ /|   |
  //  | x |   |
  //  |/ \|   |
  //  o---o---o
  //  0   3   5
  edges.emplace_back(2, 4, 3.);
  edges.emplace_back(4, 5, 3.);
  edges.emplace_back(5, 3, 3.);
  trace_and_check_collapse(edges, {{1, 3, 2.}});

  //  1   2   4
  //  o---o---o
  //  |\ /|\ /|
  //  | x | x |
  //  |/ \|/ \|
  //  o---o---o
  //  0   3   5
  edges.emplace_back(2, 5, 4.);
  edges.emplace_back(4, 3, 4.1);
  trace_and_check_collapse(edges, {{1, 3, 2.}, {4, 3, 4.1}});

  //  1   2   4
  //  o---o---o
  //  |\ /|\ /|
  //  | x | x |  + [0,4] and [1,5]
  //  |/ \|/ \|
  //  o---o---o
  //  0   3   5
  edges.emplace_back(1, 5, 5.);
  edges.emplace_back(0, 4, 5.1);
  trace_and_check_collapse(edges, {{1, 3, 2.}, {4, 3, 4.}, {0, 4, 5.1}});
}